

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::
ParseUndisambiguatedIdentifier(RustSymbolParser *this,char uppercase_namespace,int disambiguator)

{
  DecodeRustPunycodeOptions options_00;
  char cVar1;
  bool bVar2;
  Nullable<char_*> pcVar3;
  char *in_stack_ffffffffffffff78;
  int local_6c;
  char c;
  int i;
  DecodeRustPunycodeOptions options;
  int num_bytes;
  bool is_punycoded;
  int disambiguator_local;
  char uppercase_namespace_local;
  RustSymbolParser *this_local;
  
  options.out_end._7_1_ = Eat(this,'u');
  cVar1 = Peek(this);
  bVar2 = IsDigit(cVar1);
  if (bVar2) {
    options.out_end._0_4_ = 0;
    bVar2 = ParseDecimalNumber(this,(int *)&options.out_end);
    if (bVar2) {
      Eat(this,'_');
      if ((options.out_end._7_1_ & 1) != 0) {
        options.punycode_begin = this->encoding_ + (long)(int)options.out_end + (long)this->pos_;
        options.punycode_end = this->out_;
        options.out_begin = this->out_end_;
        options_00.punycode_end = options.punycode_end;
        options_00.punycode_begin = options.punycode_begin;
        options_00.out_begin = options.out_begin;
        options_00.out_end = in_stack_ffffffffffffff78;
        pcVar3 = DecodeRustPunycode(options_00);
        this->out_ = pcVar3;
        if (this->out_ == (char *)0x0) {
          return false;
        }
        this->pos_ = this->pos_ + (int)options.out_end;
      }
      if (uppercase_namespace != '\0') {
        if (uppercase_namespace == 'C') {
          bVar2 = Emit(this,"{closure");
          if (!bVar2) {
            return false;
          }
        }
        else if (uppercase_namespace == 'S') {
          bVar2 = Emit(this,"{shim");
          if (!bVar2) {
            return false;
          }
        }
        else {
          bVar2 = EmitChar(this,'{');
          if ((!bVar2) || (bVar2 = EmitChar(this,uppercase_namespace), !bVar2)) {
            return false;
          }
        }
        if ((0 < (int)options.out_end) && (bVar2 = Emit(this,":"), !bVar2)) {
          return false;
        }
      }
      if ((options.out_end._7_1_ & 1) == 0) {
        for (local_6c = 0; local_6c < (int)options.out_end; local_6c = local_6c + 1) {
          cVar1 = Take(this);
          bVar2 = IsIdentifierChar(cVar1);
          if ((!bVar2) && (((int)cVar1 & 0x80U) == 0)) {
            return false;
          }
          bVar2 = EmitChar(this,cVar1);
          if (!bVar2) {
            return false;
          }
        }
      }
      if (uppercase_namespace != '\0') {
        bVar2 = EmitChar(this,'#');
        if (!bVar2) {
          return false;
        }
        bVar2 = EmitDisambiguator(this,disambiguator);
        if (!bVar2) {
          return false;
        }
        bVar2 = EmitChar(this,'}');
        if (!bVar2) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseUndisambiguatedIdentifier(
      char uppercase_namespace = '\0', int disambiguator = 0) {
    // undisambiguated-identifier -> u? decimal-number _? bytes
    const bool is_punycoded = Eat('u');
    if (!IsDigit(Peek())) return false;
    int num_bytes = 0;
    if (!ParseDecimalNumber(num_bytes)) return false;
    (void)Eat('_');  // optional separator, needed if a digit follows
    if (is_punycoded) {
      DecodeRustPunycodeOptions options;
      options.punycode_begin = &encoding_[pos_];
      options.punycode_end = &encoding_[pos_] + num_bytes;
      options.out_begin = out_;
      options.out_end = out_end_;
      out_ = DecodeRustPunycode(options);
      if (out_ == nullptr) return false;
      pos_ += static_cast<size_t>(num_bytes);
    }

    // Emit the beginnings of braced forms like {shim:vtable#0}.
    if (uppercase_namespace != '\0') {
      switch (uppercase_namespace) {
        case 'C':
          if (!Emit("{closure")) return false;
          break;
        case 'S':
          if (!Emit("{shim")) return false;
          break;
        default:
          if (!EmitChar('{') || !EmitChar(uppercase_namespace)) return false;
          break;
      }
      if (num_bytes > 0 && !Emit(":")) return false;
    }

    // Emit the name itself.
    if (!is_punycoded) {
      for (int i = 0; i < num_bytes; ++i) {
        const char c = Take();
        if (!IsIdentifierChar(c) &&
            // The spec gives toolchains the choice of Punycode or raw UTF-8 for
            // identifiers containing code points above 0x7f, so accept bytes
            // with the high bit set.
            (c & 0x80) == 0) {
          return false;
        }
        if (!EmitChar(c)) return false;
      }
    }

    // Emit the endings of braced forms, e.g., "#42}".
    if (uppercase_namespace != '\0') {
      if (!EmitChar('#')) return false;
      if (!EmitDisambiguator(disambiguator)) return false;
      if (!EmitChar('}')) return false;
    }

    return true;
  }